

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O2

void __thiscall
cmTarget::ReportPropertyOrigin
          (cmTarget *this,string *p,string *result,string *report,string *compatibilityType)

{
  cmMakefile *this_00;
  char *pcVar1;
  mapped_type_conflict1 *pmVar2;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var3;
  cmake *this_01;
  bool bVar4;
  allocator local_f9;
  undefined1 local_f8 [32];
  cmLinkedTree<cmState::SnapshotDataType> *pcStack_d8;
  PositionType local_d0;
  string areport;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  debugProperties;
  Snapshot local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  debugProperties.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  debugProperties.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  debugProperties.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = this->Makefile;
  std::__cxx11::string::string
            ((string *)local_f8,"CMAKE_DEBUG_TARGET_PROPERTIES",(allocator *)&areport);
  pcVar1 = cmMakefile::GetDefinition(this_00,(string *)local_f8);
  std::__cxx11::string::~string((string *)local_f8);
  if (pcVar1 != (char *)0x0) {
    std::__cxx11::string::string((string *)local_f8,pcVar1,(allocator *)&areport);
    cmSystemTools::ExpandListArgument((string *)local_f8,&debugProperties,false);
    std::__cxx11::string::~string((string *)local_f8);
  }
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
           ::operator[](&this->DebugCompatiblePropertiesDone,p);
  if (*pmVar2 == false) {
    _Var3 = std::
            __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                      (debugProperties.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       debugProperties.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,p);
    bVar4 = _Var3._M_current !=
            debugProperties.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    bVar4 = false;
  }
  if (this->Makefile->Configured == true) {
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
             ::operator[](&this->DebugCompatiblePropertiesDone,p);
    *pmVar2 = true;
  }
  if (bVar4) {
    std::__cxx11::string::string((string *)&areport,(string *)compatibilityType);
    std::__cxx11::string::string((string *)&local_70," of property \"",&local_f9);
    std::operator+(&local_50,&local_70,p);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8,
                   &local_50,"\" for target \"");
    std::__cxx11::string::append((string *)&areport);
    std::__cxx11::string::~string((string *)local_f8);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::string((string *)local_f8,(string *)&this->Name);
    std::__cxx11::string::append((string *)&areport);
    std::__cxx11::string::~string((string *)local_f8);
    std::__cxx11::string::append((char *)&areport);
    std::__cxx11::string::append((string *)&areport);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8,
                   "\"):\n",report);
    std::__cxx11::string::append((string *)&areport);
    std::__cxx11::string::~string((string *)local_f8);
    this_01 = cmMakefile::GetCMakeInstance(this->Makefile);
    cmState::Snapshot::Snapshot(&local_88,(cmState *)0x0,(PositionType)ZEXT816(0));
    local_d0 = local_88.Position.Position;
    local_f8._24_8_ = local_88.State;
    pcStack_d8 = local_88.Position.Tree;
    local_f8._0_8_ = (pointer)0x0;
    local_f8._8_8_ = (pointer)0x0;
    local_f8._16_8_ = 0;
    cmake::IssueMessage(this_01,LOG,&areport,(cmListFileBacktrace *)local_f8);
    std::vector<cmListFileContext,_std::allocator<cmListFileContext>_>::~vector
              ((vector<cmListFileContext,_std::allocator<cmListFileContext>_> *)local_f8);
    std::__cxx11::string::~string((string *)&areport);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&debugProperties);
  return;
}

Assistant:

void
cmTarget::ReportPropertyOrigin(const std::string &p,
                               const std::string &result,
                               const std::string &report,
                               const std::string &compatibilityType) const
{
  std::vector<std::string> debugProperties;
  const char *debugProp =
          this->Makefile->GetDefinition("CMAKE_DEBUG_TARGET_PROPERTIES");
  if (debugProp)
    {
    cmSystemTools::ExpandListArgument(debugProp, debugProperties);
    }

  bool debugOrigin = !this->DebugCompatiblePropertiesDone[p]
                    && std::find(debugProperties.begin(),
                                 debugProperties.end(),
                                 p)
                        != debugProperties.end();

  if (this->Makefile->IsConfigured())
    {
    this->DebugCompatiblePropertiesDone[p] = true;
    }
  if (!debugOrigin)
    {
    return;
    }

  std::string areport = compatibilityType;
  areport += std::string(" of property \"") + p + "\" for target \"";
  areport += std::string(this->GetName());
  areport += "\" (result: \"";
  areport += result;
  areport += "\"):\n" + report;

  this->Makefile->GetCMakeInstance()->IssueMessage(cmake::LOG, areport);
}